

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ArenaReleaseMessageTest_Test::
TestBody(GeneratedMessageReflectionTest_ArenaReleaseMessageTest_Test *this)

{
  TestAllTypes *this_00;
  Descriptor *base_descriptor;
  undefined1 local_150 [8];
  ReflectionTester reflection_tester;
  TestAllTypes *message;
  Arena arena;
  GeneratedMessageReflectionTest_ArenaReleaseMessageTest_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&message);
  this_00 = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)&message);
  base_descriptor = proto2_unittest::TestAllTypes::descriptor();
  TestUtil::ReflectionTester::ReflectionTester((ReflectionTester *)local_150,base_descriptor);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            ((ReflectionTester *)local_150,&this_00->super_Message,IS_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection
            ((ReflectionTester *)local_150,&this_00->super_Message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            ((ReflectionTester *)local_150,&this_00->super_Message,NOT_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection
            ((ReflectionTester *)local_150,&this_00->super_Message);
  proto2_unittest::TestAllTypes::Clear(this_00);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            ((ReflectionTester *)local_150,&this_00->super_Message,CAN_BE_NULL);
  Arena::~Arena((Arena *)&message);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ArenaReleaseMessageTest) {
  Arena arena;
  unittest::TestAllTypes* message =
      Arena::Create<unittest::TestAllTypes>(&arena);
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllTypes::descriptor());

  // When nothing is set, we expect all released messages to be nullptr.
  reflection_tester.ExpectMessagesReleasedViaReflection(
      message, TestUtil::ReflectionTester::IS_NULL);

  // After fields are set we should get non-nullptr releases.
  reflection_tester.SetAllFieldsViaReflection(message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      message, TestUtil::ReflectionTester::NOT_NULL);

  // After Clear() we may or may not get a message from ReleaseMessage().
  // This is implementation specific.
  reflection_tester.SetAllFieldsViaReflection(message);
  message->Clear();
  reflection_tester.ExpectMessagesReleasedViaReflection(
      message, TestUtil::ReflectionTester::CAN_BE_NULL);
}